

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_wb97.c
# Opt level: O3

void gga_xc_wb97_init(xc_func_type *p)

{
  void *pvVar1;
  
  pvVar1 = malloc(0x78);
  p->params = pvVar1;
  xc_hyb_init_cam(p,0.0,0.0,0.0);
  if (p->info->number == 0x1d2) {
    p->nlc_b = 6.0;
    p->nlc_C = 0.01;
  }
  return;
}

Assistant:

static void
gga_xc_wb97_init(xc_func_type *p)
{
  assert(p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_xc_wb97_params));
  xc_hyb_init_cam(p, 0.0, 0.0, 0.0);
  
  switch(p->info->number){
  case XC_HYB_GGA_XC_WB97X_V:
    p->nlc_b = 6.0;
    p->nlc_C = 0.01;
    break;
  }
}